

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageString
          (BaseCase *this,MessageData *message)

{
  MessageBuilder *pMVar1;
  ulong uVar2;
  MessageBuilder local_358;
  allocator<char> local_1d1;
  string local_1d0;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  MessageData *message_local;
  BaseCase *this_local;
  
  log = (TestLog *)message;
  message_local = (MessageData *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [15])"Driver says: \"");
  pMVar1 = tcu::MessageBuilder::operator<<
                     (pMVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (log + 2));
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b3d55e);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"Empty message",&local_1d1);
    tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_QUALITY_WARNING,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    tcu::TestLog::operator<<(&local_358,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [26])"Message message was empty");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
  }
  return;
}

Assistant:

void BaseCase::verifyMessageString (const MessageData& message)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "Driver says: \"" << message.message << "\"" << TestLog::EndMessage;

	if (message.message.empty())
	{
		m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Empty message");
		log << TestLog::Message << "Message message was empty" << TestLog::EndMessage;
	}
}